

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

int32_t __thiscall
SQCompilation::NodeDiffComputer::diffDoWhile
          (NodeDiffComputer *this,DoWhileStatement *lhs,DoWhileStatement *rhs)

{
  int32_t iVar1;
  int32_t iVar2;
  
  iVar1 = diffNodes(this,&((lhs->super_LoopStatement)._body)->super_Node,
                    &((rhs->super_LoopStatement)._body)->super_Node);
  if (iVar1 <= this->limit) {
    iVar2 = diffNodes(this,&lhs->_cond->super_Node,&rhs->_cond->super_Node);
    if (this->limit < iVar2) {
      iVar1 = 0;
    }
    iVar1 = iVar1 + iVar2;
  }
  return iVar1;
}

Assistant:

int32_t diffDoWhile(const DoWhileStatement *lhs, const DoWhileStatement *rhs) {
    int32_t bodyDiff = diffNodes(lhs->body(), rhs->body());

    if (bodyDiff > limit)
      return bodyDiff;

    int32_t condDiff = diffNodes(lhs->condition(), rhs->condition());

    if (condDiff > limit)
      return condDiff;

    return bodyDiff + condDiff;
  }